

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::MultiBind::ErrorsBindBuffersTest::iterate(ErrorsBindBuffersTest *this)

{
  GLenum target;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  char cVar7;
  int iVar8;
  deUint32 dVar9;
  undefined4 extraout_var;
  long lVar11;
  long lVar12;
  TestError *pTVar13;
  GLint GVar14;
  long lVar15;
  long lVar16;
  GLuint GVar17;
  Buffer *this_00;
  int iVar18;
  long lVar19;
  GLint max_buffers;
  ulong local_318;
  GLint offset_alignment;
  GLuint buffer_ids [4];
  string local_2f8;
  GLintptr t_sizes [4];
  Enum<int,_2UL> local_2b8;
  GLuint t_buffer_ids [4];
  GLintptr offsets [4];
  GLintptr sizes [4];
  Enum<int,_2UL> local_228;
  Buffer buffer;
  undefined1 local_1b0 [8];
  GLenum local_1a8;
  long lVar10;
  
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar8);
  buffer.m_id = 0xffffffff;
  buffer.m_context = (Context *)0x0;
  buffer.m_target = 0x8892;
  MultiBind::Buffer::InitData
            (&buffer,(this->super_TestCase).m_context,0x8892,0x88ea,0x10,(GLvoid *)0x0);
  (**(code **)(lVar10 + 0x58))(0x8892,0,1,&buffer);
  local_2f8._M_string_length._0_4_ = (**(code **)(lVar10 + 0x800))();
  if ((int)local_2f8._M_string_length != 0x500) {
    local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::operator<<((ostream *)&local_1a8,"File: ");
    std::operator<<((ostream *)&local_1a8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                   );
    std::operator<<((ostream *)&local_1a8,", line: ");
    std::ostream::operator<<((ostringstream *)&local_1a8,0x66c);
    std::operator<<((ostream *)&local_1a8,". Got wrong error: ");
    local_2f8._M_dataplus._M_p = (pointer)glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_2f8,(ostream *)&local_1a8);
    std::operator<<((ostream *)&local_1a8,", expected: ");
    offsets[0] = (GLintptr)glu::getErrorName;
    offsets[1]._0_4_ = 0x500;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)offsets,(ostream *)&local_1a8);
    std::operator<<((ostream *)&local_1a8,", message: ");
    std::operator<<((ostream *)&local_1a8,"BindBuffersBase with invalid <target>");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar13,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x66c);
    __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar10 + 0x60))(0x8892,0,1,&buffer,&iterate::offset);
  local_2f8._M_string_length._0_4_ = (**(code **)(lVar10 + 0x800))();
  if ((int)local_2f8._M_string_length != 0x500) {
    local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::operator<<((ostream *)&local_1a8,"File: ");
    std::operator<<((ostream *)&local_1a8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                   );
    std::operator<<((ostream *)&local_1a8,", line: ");
    std::ostream::operator<<((ostringstream *)&local_1a8,0x66f);
    std::operator<<((ostream *)&local_1a8,". Got wrong error: ");
    local_2f8._M_dataplus._M_p = (pointer)glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_2f8,(ostream *)&local_1a8);
    std::operator<<((ostream *)&local_1a8,", expected: ");
    offsets[0] = (GLintptr)glu::getErrorName;
    offsets[1]._0_4_ = 0x500;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)offsets,(ostream *)&local_1a8);
    std::operator<<((ostream *)&local_1a8,", message: ");
    std::operator<<((ostream *)&local_1a8,"BindBuffersRange with invalid <target>");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar13,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x66f);
    __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  MultiBind::Buffer::~Buffer(&buffer);
  lVar12 = 0;
  while( true ) {
    if (lVar12 == 4) {
      tcu::TestContext::setTestResult
                (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    target = (&s_buffer_infos)[lVar12 * 5];
    iVar8 = (&DAT_016668f4)[lVar12 * 5];
    local_318 = CONCAT44(local_318._4_4_,(&DAT_016668fc)[lVar12 * 5]);
    local_1b0 = (undefined1  [8])glu::getBufferTargetName;
    local_1a8 = target;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2f8,local_1b0);
    offset_alignment = 1;
    max_buffers = 0;
    lVar15 = 0xc;
    lVar19 = 4;
    lVar16 = 0x10;
    if (iVar8 != 0) {
      (**(code **)(lVar10 + 0x868))(iVar8,&offset_alignment);
      dVar9 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar9,"GetIntegerv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                      ,0x689);
      lVar19 = (long)offset_alignment;
      lVar16 = lVar19 + 0x10;
      lVar15 = 0x10;
    }
    (**(code **)(lVar10 + 0x868))(local_318 & 0xffffffff,&max_buffers);
    dVar9 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar9,"GetIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x692);
    iVar8 = max_buffers + -1;
    if (3 < max_buffers) {
      iVar8 = 3;
    }
    local_318 = (ulong)iVar8;
    lVar11 = 0x10;
    do {
      *(undefined4 *)((long)&local_228.m_getName + lVar11) = 0xffffffff;
      *(undefined8 *)((long)&local_228.m_value + lVar11) = 0;
      *(undefined4 *)((long)&buffer.m_id + lVar11) = 0x8892;
      lVar11 = lVar11 + 0x18;
    } while (lVar11 != 0x70);
    GVar14 = max_buffers;
    if (3 < max_buffers) {
      GVar14 = 4;
    }
    this_00 = &buffer;
    for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 4) {
      MultiBind::Buffer::InitData
                (this_00,(this->super_TestCase).m_context,target,0x88ea,lVar16,(GLvoid *)0x0);
      *(GLuint *)((long)buffer_ids + lVar11) = this_00->m_id;
      *(long *)((long)offsets + lVar11 * 2) = lVar19;
      *(long *)((long)sizes + lVar11 * 2) = lVar15;
      this_00 = this_00 + 1;
    }
    iVar8 = max_buffers + -3;
    iVar18 = max_buffers + 1;
    if (max_buffers < 4) {
      iVar8 = 0;
    }
    else {
      iVar18 = 4;
    }
    (**(code **)(lVar10 + 0x58))(target,iVar8,iVar18,buffer_ids);
    t_buffer_ids[2] = (**(code **)(lVar10 + 0x800))();
    if (t_buffer_ids[2] != 0x502) {
      local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<((ostream *)&local_1a8,"File: ");
      std::operator<<((ostream *)&local_1a8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                     );
      std::operator<<((ostream *)&local_1a8,", line: ");
      std::ostream::operator<<((ostringstream *)&local_1a8,0x6c0);
      std::operator<<((ostream *)&local_1a8,". Got wrong error: ");
      t_buffer_ids._0_8_ = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)t_buffer_ids,(ostream *)&local_1a8);
      std::operator<<((ostream *)&local_1a8,", expected: ");
      t_sizes[0] = (GLintptr)glu::getErrorName;
      t_sizes[1]._0_4_ = 0x502;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)t_sizes,(ostream *)&local_1a8);
      std::operator<<((ostream *)&local_1a8,", message: ");
      std::operator<<((ostream *)&local_1a8,
                      "BindBuffersBase with invalid <first> + <count>, target: ");
      std::operator<<((ostream *)&local_1a8,(string *)&local_2f8);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar13,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x6c0);
      __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar10 + 0x60))(target,iVar8,iVar18,buffer_ids,offsets,sizes);
    t_buffer_ids[2] = (**(code **)(lVar10 + 0x800))();
    if (t_buffer_ids[2] != 0x502) {
      local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<((ostream *)&local_1a8,"File: ");
      std::operator<<((ostream *)&local_1a8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                     );
      std::operator<<((ostream *)&local_1a8,", line: ");
      std::ostream::operator<<((ostringstream *)&local_1a8,0x6c4);
      std::operator<<((ostream *)&local_1a8,". Got wrong error: ");
      t_buffer_ids._0_8_ = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)t_buffer_ids,(ostream *)&local_1a8);
      std::operator<<((ostream *)&local_1a8,", expected: ");
      t_sizes[0] = (GLintptr)glu::getErrorName;
      t_sizes[1]._0_4_ = 0x502;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)t_sizes,(ostream *)&local_1a8);
      std::operator<<((ostream *)&local_1a8,", message: ");
      std::operator<<((ostream *)&local_1a8,
                      "BindBuffersRange with invalid <first> + <count>, target: ");
      std::operator<<((ostream *)&local_1a8,(string *)&local_2f8);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar13,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x6c4);
      __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    GVar17 = 1;
    while (cVar7 = (**(code **)(lVar10 + 0xc68))(GVar17), cVar7 == '\x01') {
      GVar17 = GVar17 + 1;
    }
    t_buffer_ids[local_318] = GVar17;
    (**(code **)(lVar10 + 0x58))(target,0,GVar14,t_buffer_ids);
    iVar8 = (**(code **)(lVar10 + 0x800))();
    if (iVar8 != 0x502) {
      local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<((ostream *)&local_1a8,"File: ");
      std::operator<<((ostream *)&local_1a8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                     );
      std::operator<<((ostream *)&local_1a8,", line: ");
      std::ostream::operator<<((ostringstream *)&local_1a8,0x6df);
      std::operator<<((ostream *)&local_1a8,". Got wrong error: ");
      t_sizes[0] = (GLintptr)glu::getErrorName;
      t_sizes[1]._0_4_ = iVar8;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)t_sizes,(ostream *)&local_1a8);
      std::operator<<((ostream *)&local_1a8,", expected: ");
      local_2b8.m_getName = glu::getErrorName;
      local_2b8.m_value = 0x502;
      tcu::Format::Enum<int,_2UL>::toStream(&local_2b8,(ostream *)&local_1a8);
      std::operator<<((ostream *)&local_1a8,", message: ");
      std::operator<<((ostream *)&local_1a8,"BindBuffersBase with invalid buffer id, target: ");
      std::operator<<((ostream *)&local_1a8,(string *)&local_2f8);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar13,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x6df);
      __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar10 + 0x60))(target,0,GVar14,t_buffer_ids,offsets,sizes);
    iVar8 = (**(code **)(lVar10 + 0x800))();
    uVar4 = sizes[3]._4_4_;
    uVar3 = (undefined4)sizes[3];
    uVar2 = sizes[2]._4_4_;
    uVar1 = (undefined4)sizes[2];
    if (iVar8 != 0x502) {
      local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<((ostream *)&local_1a8,"File: ");
      std::operator<<((ostream *)&local_1a8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                     );
      std::operator<<((ostream *)&local_1a8,", line: ");
      std::ostream::operator<<((ostringstream *)&local_1a8,0x6e2);
      std::operator<<((ostream *)&local_1a8,". Got wrong error: ");
      t_sizes[0] = (GLintptr)glu::getErrorName;
      t_sizes[1]._0_4_ = iVar8;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)t_sizes,(ostream *)&local_1a8);
      std::operator<<((ostream *)&local_1a8,", expected: ");
      local_2b8.m_getName = glu::getErrorName;
      local_2b8.m_value = 0x502;
      tcu::Format::Enum<int,_2UL>::toStream(&local_2b8,(ostream *)&local_1a8);
      std::operator<<((ostream *)&local_1a8,", message: ");
      std::operator<<((ostream *)&local_1a8,"BindBuffersRange with invalid buffer id, target: ");
      std::operator<<((ostream *)&local_1a8,(string *)&local_2f8);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar13,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x6e2);
      __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    t_buffer_ids[0] = (undefined4)offsets[0];
    t_buffer_ids[1] = offsets[0]._4_4_;
    t_sizes[1]._0_4_ = (undefined4)sizes[1];
    t_sizes[1]._4_4_ = sizes[1]._4_4_;
    (t_buffer_ids + local_318 * 2)[0] = 0xffffffff;
    (t_buffer_ids + local_318 * 2)[1] = 0xffffffff;
    t_sizes[2]._0_4_ = uVar1;
    t_sizes[2]._4_4_ = uVar2;
    t_sizes[3]._0_4_ = uVar3;
    t_sizes[3]._4_4_ = uVar4;
    t_sizes[local_318] = -1;
    (**(code **)(lVar10 + 0x60))(target,0,GVar14,buffer_ids,t_buffer_ids,sizes);
    local_2b8.m_value = (**(code **)(lVar10 + 0x800))();
    if (local_2b8.m_value != 0x501) {
      local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<((ostream *)&local_1a8,"File: ");
      std::operator<<((ostream *)&local_1a8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                     );
      std::operator<<((ostream *)&local_1a8,", line: ");
      std::ostream::operator<<((ostringstream *)&local_1a8,0x6f3);
      std::operator<<((ostream *)&local_1a8,". Got wrong error: ");
      local_2b8.m_getName = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_2b8,(ostream *)&local_1a8);
      std::operator<<((ostream *)&local_1a8,", expected: ");
      local_228.m_getName = glu::getErrorName;
      local_228.m_value = 0x501;
      tcu::Format::Enum<int,_2UL>::toStream(&local_228,(ostream *)&local_1a8);
      std::operator<<((ostream *)&local_1a8,", message: ");
      std::operator<<((ostream *)&local_1a8,"BindBuffersRange with negative offset, target: ");
      std::operator<<((ostream *)&local_1a8,(string *)&local_2f8);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar13,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x6f3);
      __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar10 + 0x60))(target,0,GVar14,buffer_ids,offsets,t_sizes);
    local_2b8.m_value = (**(code **)(lVar10 + 0x800))();
    uVar6 = sizes[3]._4_4_;
    uVar5 = (undefined4)sizes[3];
    uVar4 = sizes[2]._4_4_;
    uVar3 = (undefined4)sizes[2];
    uVar2 = sizes[1]._4_4_;
    uVar1 = (undefined4)sizes[1];
    if (local_2b8.m_value != 0x501) {
      local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<((ostream *)&local_1a8,"File: ");
      std::operator<<((ostream *)&local_1a8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                     );
      std::operator<<((ostream *)&local_1a8,", line: ");
      std::ostream::operator<<((ostringstream *)&local_1a8,0x6f7);
      std::operator<<((ostream *)&local_1a8,". Got wrong error: ");
      local_2b8.m_getName = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_2b8,(ostream *)&local_1a8);
      std::operator<<((ostream *)&local_1a8,", expected: ");
      local_228.m_getName = glu::getErrorName;
      local_228.m_value = 0x501;
      tcu::Format::Enum<int,_2UL>::toStream(&local_228,(ostream *)&local_1a8);
      std::operator<<((ostream *)&local_1a8,", message: ");
      std::operator<<((ostream *)&local_1a8,"BindBuffersRange with negative size, target: ");
      std::operator<<((ostream *)&local_1a8,(string *)&local_2f8);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar13,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 ,0x6f7);
      __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    t_buffer_ids._8_8_ = (ulong)offsets[1]._4_4_ << 0x20;
    t_buffer_ids[0] = (undefined4)offsets[0];
    t_buffer_ids[1] = offsets[0]._4_4_;
    *(long *)(t_buffer_ids + local_318 * 2) = *(long *)(t_buffer_ids + local_318 * 2) + -1;
    t_sizes[1]._0_4_ = uVar1;
    t_sizes[1]._4_4_ = uVar2;
    t_sizes[2]._0_4_ = uVar3;
    t_sizes[2]._4_4_ = uVar4;
    t_sizes[3]._0_4_ = uVar5;
    t_sizes[3]._4_4_ = uVar6;
    t_sizes[local_318] = lVar15 + -1;
    (**(code **)(lVar10 + 0x60))(target,0,GVar14,buffer_ids,t_buffer_ids);
    local_2b8.m_value = (**(code **)(lVar10 + 0x800))();
    if (local_2b8.m_value != 0x501) break;
    if (target == 0x8c8e) {
      (**(code **)(lVar10 + 0x60))(0x8c8e,0,GVar14,buffer_ids,offsets);
      local_2b8.m_value = (**(code **)(lVar10 + 0x800))();
      if (local_2b8.m_value != 0x501) {
        local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::operator<<((ostream *)&local_1a8,"File: ");
        std::operator<<((ostream *)&local_1a8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                       );
        std::operator<<((ostream *)&local_1a8,", line: ");
        std::ostream::operator<<((ostringstream *)&local_1a8,0x70e);
        std::operator<<((ostream *)&local_1a8,". Got wrong error: ");
        local_2b8.m_getName = glu::getErrorName;
        tcu::Format::Enum<int,_2UL>::toStream(&local_2b8,(ostream *)&local_1a8);
        std::operator<<((ostream *)&local_1a8,", expected: ");
        local_228.m_getName = glu::getErrorName;
        local_228.m_value = 0x501;
        tcu::Format::Enum<int,_2UL>::toStream(&local_228,(ostream *)&local_1a8);
        std::operator<<((ostream *)&local_1a8,", message: ");
        std::operator<<((ostream *)&local_1a8,"BindBuffersRange with invalid <size>, target: ");
        std::operator<<((ostream *)&local_1a8,(string *)&local_2f8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar13,"Invalid error generated",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                   ,0x70e);
        __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
    }
    lVar16 = 0x48;
    do {
      MultiBind::Buffer::~Buffer((Buffer *)((long)&buffer.m_id + lVar16));
      lVar16 = lVar16 + -0x18;
    } while (lVar16 != -0x18);
    std::__cxx11::string::~string((string *)&local_2f8);
    lVar12 = lVar12 + 1;
  }
  local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::operator<<((ostream *)&local_1a8,"File: ");
  std::operator<<((ostream *)&local_1a8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 );
  std::operator<<((ostream *)&local_1a8,", line: ");
  std::ostream::operator<<((ostringstream *)&local_1a8,0x708);
  std::operator<<((ostream *)&local_1a8,". Got wrong error: ");
  local_2b8.m_getName = glu::getErrorName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_2b8,(ostream *)&local_1a8);
  std::operator<<((ostream *)&local_1a8,", expected: ");
  local_228.m_getName = glu::getErrorName;
  local_228.m_value = 0x501;
  tcu::Format::Enum<int,_2UL>::toStream(&local_228,(ostream *)&local_1a8);
  std::operator<<((ostream *)&local_1a8,", message: ");
  std::operator<<((ostream *)&local_1a8,"BindBuffersRange with invalid <offset>, target: ");
  std::operator<<((ostream *)&local_1a8,(string *)&local_2f8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar13,"Invalid error generated",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
             ,0x708);
  __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult ErrorsBindBuffersTest::iterate()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

#if DEBUG_ENBALE_MESSAGE_CALLBACK
	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");
#endif /* DEBUG_ENBALE_MESSAGE_CALLBACK */

	/* - INVALID_ENUM when <target> is not valid; */
	{
		static const GLintptr buffer_size = 16;
		static const GLsizei  count		  = 1;
		static const GLuint   first		  = 0;
		static const GLintptr offset	  = 4;
		static const GLintptr size		  = buffer_size - offset;

		Buffer buffer;

		buffer.InitData(m_context, GL_ARRAY_BUFFER, GL_DYNAMIC_COPY, buffer_size, 0 /* data */);

		gl.bindBuffersBase(GL_ARRAY_BUFFER, first, count, &buffer.m_id);
		CHECK_ERROR(GL_INVALID_ENUM, "BindBuffersBase with invalid <target>");

		gl.bindBuffersRange(GL_ARRAY_BUFFER, first, count, &buffer.m_id, &offset, &size);
		CHECK_ERROR(GL_INVALID_ENUM, "BindBuffersRange with invalid <target>");
	}

	for (size_t i = 0; i < s_n_buffer_tragets; ++i)
	{
		static const GLsizei n_buffers = 4;

		const GLenum	   pname_alignment = s_buffer_infos[i].m_pname_alignment;
		const GLenum	   pname_max	   = s_buffer_infos[i].m_pname_max;
		const GLenum	   target		   = s_buffer_infos[i].m_target;
		const std::string& target_name	 = glu::getBufferTargetStr(target).toString();

		GLintptr buffer_size	  = 16;
		GLsizei  count			  = n_buffers;
		GLuint   first			  = 0;
		GLuint   invalid_id		  = 1; /* Start with 1, as 0 is not valid name */
		GLintptr offset			  = 4; /* ATOMIC and XFB require alignment of 4 */
		GLint	offset_alignment = 1;
		GLint	max_buffers	  = 0;
		GLintptr size			  = buffer_size - offset;
		size_t   validated_index  = n_buffers - 1;

		/* Get alignment */
		if (0 != pname_alignment)
		{
			gl.getIntegerv(pname_alignment, &offset_alignment);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

			buffer_size += offset_alignment;
			offset = offset_alignment;
			size   = buffer_size - offset;
		}

		/* Get max */
		gl.getIntegerv(pname_max, &max_buffers);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

		/* Select count so <first + count> does not exceed max.
		 * Validated index shall be in the specified range.
		 */
		if (n_buffers > max_buffers)
		{
			count			= max_buffers;
			validated_index = max_buffers - 1;
		}

		/* Storage */
		Buffer   buffer[n_buffers];
		GLuint   buffer_ids[n_buffers];
		GLintptr offsets[n_buffers];
		GLintptr sizes[n_buffers];

		/* Prepare buffers */
		for (size_t j = 0; j < n_buffers; ++j)
		{
			buffer[j].InitData(m_context, target, GL_DYNAMIC_COPY, buffer_size, 0 /* data */);

			buffer_ids[j] = buffer[j].m_id;
			offsets[j]	= offset;
			sizes[j]	  = size;
		}

		/* - INVALID_OPERATION when <first> + <count> is greater than allowed limit; */
		{
			GLsizei t_count = n_buffers;
			GLuint  t_first = 0;

			/* Select first so <first + count> exceeds max, avoid negative first */
			if (n_buffers <= max_buffers)
			{
				t_first = max_buffers - n_buffers + 1;
			}
			else
			{
				t_count = max_buffers + 1;
				/* first = 0; */
			}

			/* Test */
			gl.bindBuffersBase(target, t_first, t_count, buffer_ids);
			CHECK_ERROR(GL_INVALID_OPERATION,
						"BindBuffersBase with invalid <first> + <count>, target: " << target_name);

			gl.bindBuffersRange(target, t_first, t_count, buffer_ids, offsets, sizes);
			CHECK_ERROR(GL_INVALID_OPERATION,
						"BindBuffersRange with invalid <first> + <count>, target: " << target_name);
		}

		/* - INVALID_OPERATION if any value in <buffers> is not zero or the name of
		 * existing buffer;
		 */
		{
			GLuint t_buffer_ids[n_buffers];

			memcpy(t_buffer_ids, buffer_ids, sizeof(buffer_ids));

			/* Find invalid id */
			while (1)
			{
				if (GL_TRUE != gl.isBuffer(invalid_id))
				{
					break;
				}

				invalid_id += 1;
			}

			/* Invalidate the entry */
			t_buffer_ids[validated_index] = invalid_id;

			/* Test */
			gl.bindBuffersBase(target, first, count, t_buffer_ids);
			CHECK_ERROR(GL_INVALID_OPERATION, "BindBuffersBase with invalid buffer id, target: " << target_name);

			gl.bindBuffersRange(target, first, count, t_buffer_ids, offsets, sizes);
			CHECK_ERROR(GL_INVALID_OPERATION, "BindBuffersRange with invalid buffer id, target: " << target_name);
		}

		/* - INVALID_VALUE if any value in <offsets> is less than zero; */
		{
			GLintptr t_offsets[n_buffers];
			GLintptr t_sizes[n_buffers];

			memcpy(t_offsets, offsets, sizeof(offsets));
			memcpy(t_sizes, sizes, sizeof(sizes));

			/* Invalidate the entry */
			t_offsets[validated_index] = -1;
			t_sizes[validated_index]   = -1;

			/* Test */
			gl.bindBuffersRange(target, first, count, buffer_ids, t_offsets, sizes);
			CHECK_ERROR(GL_INVALID_VALUE, "BindBuffersRange with negative offset, target: " << target_name);

			/* Test */
			gl.bindBuffersRange(target, first, count, buffer_ids, offsets, t_sizes);
			CHECK_ERROR(GL_INVALID_VALUE, "BindBuffersRange with negative size, target: " << target_name);
		}

		/* - INVALID_VALUE if any pair of <offsets> and <sizes> exceeds limits. */
		{
			GLintptr t_offsets[n_buffers];
			GLintptr t_sizes[n_buffers];

			memcpy(t_offsets, offsets, sizeof(offsets));
			memcpy(t_sizes, sizes, sizeof(sizes));

			/* Invalidate the entry */
			t_offsets[validated_index] -= 1;	 /* Not aligned by required value */
			t_sizes[validated_index] = size - 1; /* Not aligned by required value */

			/* Test */
			gl.bindBuffersRange(target, first, count, buffer_ids, t_offsets, sizes);
			CHECK_ERROR(GL_INVALID_VALUE, "BindBuffersRange with invalid <offset>, target: " << target_name);

			/* Test */
			if (GL_TRANSFORM_FEEDBACK_BUFFER == target)
			{
				gl.bindBuffersRange(target, first, count, buffer_ids, offsets, t_sizes);
				CHECK_ERROR(GL_INVALID_VALUE, "BindBuffersRange with invalid <size>, target: " << target_name);
			}
		}
	}

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return tcu::TestNode::STOP;
}